

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::commoditizedUnit(string *unit_string,uint64_t match_flags)

{
  long lVar1;
  size_type sVar2;
  long lVar3;
  unit_data uVar4;
  uint32_t uVar5;
  int iVar6;
  const_iterator cVar7;
  long lVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  double dVar11;
  precise_unit pVar12;
  precise_unit bunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cstring;
  int ccindex;
  undefined1 local_3cb;
  undefined1 local_3ca;
  undefined1 local_3c9;
  precise_unit local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  double local_398;
  int local_38c;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_58;
  
  lVar8 = 0xfa94a488;
  sVar2 = unit_string->_M_string_length;
  dVar11 = NAN;
  if (sVar2 == 0) goto LAB_0040a76d;
  local_38c = (int)sVar2 + -1;
  lVar9 = sVar2 - 2;
  do {
    if (lVar9 == -2) goto LAB_0040a76d;
    lVar1 = lVar9 + -1;
    local_38c = local_38c + -1;
    lVar3 = lVar9 + 1;
    lVar9 = lVar1;
  } while ((unit_string->_M_dataplus)._M_p[lVar3] != '}');
  segmentcheckReverse(unit_string,'{',&local_38c);
  lVar9 = (long)local_38c;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_3b8,unit_string,lVar9 + 2,lVar1 - lVar9);
  if (lVar9 < 0) {
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_3b8._M_dataplus._M_p,
               local_3b8._M_dataplus._M_p + local_3b8._M_string_length);
    uVar5 = getCommodity(&local_368);
    lVar8 = (ulong)uVar5 << 0x20;
    dVar11 = 1.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      dVar11 = 1.0;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_348,unit_string,0,lVar9 + 1);
    pVar12 = unit_from_string_internal(&local_348,match_flags + 0x4000000);
    local_3c8 = pVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (pVar12.base_units_ == (unit_data)0xfa94a488 || NAN(pVar12.multiplier_)) {
      dVar11 = NAN;
    }
    else {
      if (((uint)pVar12.base_units_ & 0xfffffff) == 1) {
        if (commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::commUnits_abi_cxx11_ ==
            '\0') {
          iVar6 = __cxa_guard_acquire(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                       commUnits_abi_cxx11_);
          if (iVar6 != 0) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (&local_328,(char (*) [8])"mercury",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[14],_true>
                      (&local_2f8,(char (*) [14])"mercurycolumn",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_2c8,(char (*) [13])"mercuryguage",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[10],_true>
                      (&local_298,(char (*) [10])"mercury_i",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[3],_true>
                      (&local_268,(char (*) [3])0x45401b,
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[6],_true>
                      (&local_238,(char (*) [6])"water",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[12],_true>
                      (&local_208,(char (*) [12])"watercolumn",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (&local_1d8,(char (*) [8])"water_i",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_1a8,(char (*) [11])"waterguage",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[4],_true>
                      (&local_178,(char (*) [4])0x454035,
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_148,(char (*) [13])"mercury_[00]",
                       (precise_unit *)precise::pressure::bases::Hg_0);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_118,(char (*) [11])"water_[04]",
                       (precise_unit *)precise::pressure::bases::water_4);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_e8,(char (*) [11])"water_[39]",
                       (precise_unit *)precise::pressure::bases::water_39);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_b8,(char (*) [13])"mercury_[32]",
                       (precise_unit *)precise::pressure::bases::Hg_32);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_88,(char (*) [13])"mercury_[60]",
                       (precise_unit *)precise::pressure::bases::Hg_60);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_58,(char (*) [11])"water_[60]",
                       (precise_unit *)precise::pressure::bases::water_60);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_Hashtable<std::pair<std::__cxx11::string_const,units::precise_unit>const*>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                           commUnits_abi_cxx11_,&local_328,&stack0xffffffffffffffd8,0,&local_3c9,
                       &local_3ca,&local_3cb);
            lVar8 = -0x300;
            paVar10 = &local_58.first.field_2;
            do {
              if (paVar10 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar10->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                                paVar10->_M_allocated_capacity + 1);
              }
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar10->_M_allocated_capacity + -6);
              lVar8 = lVar8 + 0x30;
            } while (lVar8 != 0);
            __cxa_atexit(std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                         ::~unordered_map,
                         &commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                          commUnits_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                 commUnits_abi_cxx11_);
          }
        }
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                        commUnits_abi_cxx11_._M_h,&local_3b8);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
            ._M_cur != (__node_type *)0x0) {
          dVar11 = local_3c8.multiplier_;
          local_398 = *(double *)
                       ((long)cVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                              ._M_cur + 0x28);
          uVar4 = detail::unit_data::operator*
                            (&local_3c8.base_units_,
                             (unit_data *)
                             ((long)cVar7.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                    ._M_cur + 0x30));
          dVar11 = dVar11 * local_398;
          lVar8 = CONCAT44(*(uint *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                           ._M_cur + 0x34) | local_3c8.commodity_,uVar4);
          goto LAB_0040a746;
        }
      }
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,local_3b8._M_dataplus._M_p,
                 local_3b8._M_dataplus._M_p + local_3b8._M_string_length);
      uVar5 = getCommodity(&local_388);
      dVar11 = local_3c8.multiplier_;
      lVar8 = CONCAT44(uVar5 | local_3c8.commodity_,local_3c8.base_units_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0040a746:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
LAB_0040a76d:
  pVar12.base_units_ = (unit_data)(int)lVar8;
  pVar12.commodity_ = (int)((ulong)lVar8 >> 0x20);
  pVar12.multiplier_ = dVar11;
  return pVar12;
}

Assistant:

static precise_unit
    commoditizedUnit(const std::string& unit_string, std::uint64_t match_flags)
{
    auto finish = unit_string.find_last_of('}');
    if (finish == std::string::npos) {
        // there are checks before this would get called that would catch that
        // error but it is left in place just in case it gets called in an
        // isolated context

        // LCOV_EXCL_START
        return precise::invalid;
        // LCOV_EXCL_STOP
    }
    auto ccindex = static_cast<int>(finish) - 1;
    segmentcheckReverse(unit_string, '{', ccindex);

    auto cstring = unit_string.substr(
        static_cast<size_t>(ccindex) + 2, finish - ccindex - 2);

    if (ccindex < 0) {
        return {1.0, precise::one, getCommodity(cstring)};
    }

    auto bunit = unit_from_string_internal(
        unit_string.substr(0, static_cast<size_t>(ccindex) + 1),
        match_flags + no_commodities);
    if (!is_error(bunit)) {
        if (bunit.has_same_base(m)) {
            static const std::unordered_map<std::string, precise_unit>
                commUnits{
                    {"mercury", precise::pressure::bases::Hg},
                    {"mercurycolumn", precise::pressure::bases::Hg},
                    {"mercuryguage", precise::pressure::bases::Hg},
                    {"mercury_i", precise::pressure::bases::Hg},
                    {"Hg", precise::pressure::bases::Hg},
                    {"water", precise::pressure::bases::water},
                    {"watercolumn", precise::pressure::bases::water},
                    {"water_i", precise::pressure::bases::water},
                    {"waterguage", precise::pressure::bases::water},
                    {"H2O", precise::pressure::bases::water},
                    {"mercury_[00]", precise::pressure::bases::Hg_0},
                    {"water_[04]", precise::pressure::bases::water_4},
                    {"water_[39]", precise::pressure::bases::water_39},
                    {"mercury_[32]", precise::pressure::bases::Hg_32},
                    {"mercury_[60]", precise::pressure::bases::Hg_60},
                    {"water_[60]", precise::pressure::bases::water_60},
                };
            auto tunit = commUnits.find(cstring);
            if (tunit != commUnits.end()) {
                return bunit * tunit->second;
            }
        }
        return {1.0, bunit, getCommodity(cstring)};
    }
    return precise::invalid;
}